

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox_p.h
# Opt level: O1

void QComboBoxDelegate::setSeparator(QAbstractItemModel *model,QModelIndex *index)

{
  uint uVar1;
  QModelIndex *pQVar2;
  long lVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QArrayData *local_60 [3];
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QVar4.m_data = (storage_type *)0x9;
  QVar4.m_size = (qsizetype)local_60;
  QString::fromLatin1(QVar4);
  ::QVariant::QVariant(&local_48,(QString *)local_60);
  (**(code **)(*(long *)model + 0x98))(model,index,&local_48,0xc);
  ::QVariant::~QVariant(&local_48);
  if (local_60[0] != (QArrayData *)0x0) {
    LOCK();
    (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_60[0],2,0x10);
    }
  }
  pQVar2 = (QModelIndex *)QMetaObject::cast((QObject *)&QStandardItemModel::staticMetaObject);
  if (pQVar2 != (QModelIndex *)0x0) {
    lVar3 = QStandardItemModel::itemFromIndex(pQVar2);
    if (lVar3 != 0) {
      uVar1 = QStandardItem::flags();
      QStandardItem::setFlags(lVar3,uVar1 & 0xffffffde);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void setSeparator(QAbstractItemModel *model, const QModelIndex &index) {
        model->setData(index, QString::fromLatin1("separator"), Qt::AccessibleDescriptionRole);
        if (QStandardItemModel *m = qobject_cast<QStandardItemModel*>(model))
            if (QStandardItem *item = m->itemFromIndex(index))
                item->setFlags(item->flags() & ~(Qt::ItemIsSelectable|Qt::ItemIsEnabled));
    }